

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_softsynth_mididevice.cpp
# Opt level: O0

int __thiscall SoftSynthMIDIDevice::Resume(SoftSynthMIDIDevice *this)

{
  uint uVar1;
  SoftSynthMIDIDevice *this_local;
  
  if ((this->Started & 1U) == 0) {
    uVar1 = (*this->Stream->_vptr_SoundStream[2])(0x3f800000,this->Stream,1);
    if ((uVar1 & 1) == 0) {
      this_local._4_4_ = 1;
    }
    else {
      this->Started = true;
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int SoftSynthMIDIDevice::Resume()
{
	if (!Started)
	{
		if (Stream->Play(true, 1))
		{
			Started = true;
			return 0;
		}
		return 1;
	}
	return 0;
}